

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O2

DatabaseHeader *
duckdb::DatabaseHeader::Read
          (DatabaseHeader *__return_storage_ptr__,MainHeader *main_header,ReadStream *source)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  IOException *this;
  allocator local_49;
  string local_48;
  
  uVar1 = ReadStream::Read<unsigned_long>(source);
  __return_storage_ptr__->iteration = uVar1;
  uVar1 = ReadStream::Read<unsigned_long>(source);
  __return_storage_ptr__->meta_block = uVar1;
  uVar1 = ReadStream::Read<unsigned_long>(source);
  __return_storage_ptr__->free_list = uVar1;
  uVar1 = ReadStream::Read<unsigned_long>(source);
  __return_storage_ptr__->block_count = uVar1;
  uVar2 = ReadStream::Read<unsigned_long>(source);
  uVar1 = 0x40000;
  if (uVar2 != 0) {
    uVar1 = uVar2;
  }
  __return_storage_ptr__->block_alloc_size = uVar1;
  uVar2 = ReadStream::Read<unsigned_long>(source);
  uVar1 = 0x800;
  if (uVar2 != 0) {
    uVar1 = uVar2;
  }
  __return_storage_ptr__->vector_size = uVar1;
  if (uVar1 == 0x800) {
    if (main_header->version_number == 0x40) {
      uVar1 = 1;
    }
    else {
      uVar1 = ReadStream::Read<unsigned_long>(source);
    }
    __return_storage_ptr__->serialization_compatibility = uVar1;
    return __return_storage_ptr__;
  }
  this = (IOException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_48,
             "Cannot read database file: DuckDB\'s compiled vector size is %llu bytes, but the file has a vector size of %llu bytes."
             ,&local_49);
  IOException::IOException<unsigned_int,unsigned_long>(this,&local_48,0x800,uVar1);
  __cxa_throw(this,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

DatabaseHeader DatabaseHeader::Read(const MainHeader &main_header, ReadStream &source) {
	DatabaseHeader header;
	header.iteration = source.Read<uint64_t>();
	header.meta_block = source.Read<idx_t>();
	header.free_list = source.Read<idx_t>();
	header.block_count = source.Read<uint64_t>();
	header.block_alloc_size = source.Read<idx_t>();

	// backwards compatibility
	if (!header.block_alloc_size) {
		header.block_alloc_size = DEFAULT_BLOCK_ALLOC_SIZE;
	}

	header.vector_size = source.Read<idx_t>();
	if (!header.vector_size) {
		// backwards compatibility
		header.vector_size = DEFAULT_STANDARD_VECTOR_SIZE;
	}
	if (header.vector_size != STANDARD_VECTOR_SIZE) {
		throw IOException("Cannot read database file: DuckDB's compiled vector size is %llu bytes, but the file has a "
		                  "vector size of %llu bytes.",
		                  STANDARD_VECTOR_SIZE, header.vector_size);
	}
	if (main_header.version_number == 64) {
		// version number 64 does not have the serialization compatibility in the file - default to 1
		header.serialization_compatibility = 1;
	} else {
		// read from the file
		header.serialization_compatibility = source.Read<idx_t>();
	}
	return header;
}